

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

char * cmGetDefinition(void *arg,char *def)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,def,&local_31);
  pcVar1 = cmMakefile::GetDefinition((cmMakefile *)arg,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pcVar1;
}

Assistant:

const char* CCONV cmGetDefinition(void *arg,const char*def)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  return mf->GetDefinition(def);
}